

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pathtracer_device.cpp
# Opt level: O1

Vec3fa __thiscall
embree::OBJMaterial__eval
          (embree *this,ISPCOBJMaterial *material,BRDF *brdf,Vec3fa *wo,DifferentialGeometry *dg,
          Vec3fa *wi)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float extraout_XMM0_Db;
  ulong uVar6;
  float fVar7;
  float fVar8;
  Vec3fa VVar9;
  
  fVar4 = 0.0;
  fVar5 = 0.0;
  *(undefined8 *)this = 0;
  *(undefined8 *)(this + 8) = 0;
  fVar7 = (brdf->Kd).field_0.m128[1];
  fVar8 = (brdf->Kd).field_0.m128[2];
  fVar1 = (brdf->Kd).field_0.m128[0];
  if (fVar7 <= fVar1) {
    fVar7 = fVar1;
  }
  if (fVar8 <= fVar7) {
    fVar8 = fVar7;
  }
  fVar7 = (brdf->Ks).field_0.m128[1];
  fVar1 = (brdf->Ks).field_0.m128[0];
  if (fVar7 <= fVar1) {
    fVar7 = fVar1;
  }
  fVar1 = (brdf->Ks).field_0.m128[2];
  if (fVar1 <= fVar7) {
    fVar1 = fVar7;
  }
  uVar6 = (ulong)(uint)fVar1;
  if (0.0 < fVar8) {
    fVar7 = (wi->field_0).m128[2] * (dg->Ns).field_0.m128[2] +
            (wi->field_0).m128[1] * (dg->Ns).field_0.m128[1] +
            (wi->field_0).m128[0] * (dg->Ns).field_0.m128[0];
    if (1.0 <= fVar7) {
      fVar7 = 1.0;
    }
    fVar8 = 0.0;
    if (0.0 <= fVar7) {
      fVar8 = fVar7;
    }
    fVar8 = fVar8 * 0.31830987;
    fVar7 = (brdf->Kd).field_0.m128[1];
    fVar2 = (brdf->Kd).field_0.m128[2];
    fVar3 = (brdf->Kd).field_0.m128[3];
    *(float *)this = fVar8 * (brdf->Kd).field_0.m128[0] + 0.0;
    *(float *)(this + 4) = fVar8 * fVar7 + 0.0;
    *(float *)(this + 8) = fVar8 * fVar2 + 0.0;
    *(float *)(this + 0xc) = fVar8 * fVar3 + 0.0;
  }
  if (0.0 < fVar1) {
    fVar7 = (dg->Ns).field_0.m128[0];
    fVar8 = (dg->Ns).field_0.m128[1];
    fVar1 = (dg->Ns).field_0.m128[2];
    fVar4 = (wo->field_0).m128[2] * fVar1 +
            (wo->field_0).m128[1] * fVar8 + (wo->field_0).m128[0] * fVar7;
    fVar4 = fVar4 + fVar4;
    fVar5 = (fVar4 * (dg->Ns).field_0.m128[3] - (wo->field_0).m128[3]) * (wi->field_0).m128[3];
    fVar4 = (fVar4 * fVar1 - (wo->field_0).m128[2]) * (wi->field_0).m128[2] +
            (fVar4 * fVar8 - (wo->field_0).m128[1]) * (wi->field_0).m128[1] +
            (fVar4 * fVar7 - (wo->field_0).m128[0]) * (wi->field_0).m128[0];
    uVar6 = 0;
    if (0.0 < fVar4) {
      fVar7 = brdf->Ns;
      if (fVar4 <= 1e-10) {
        fVar4 = 1e-10;
      }
      fVar4 = powf(fVar4,fVar7);
      fVar4 = fVar4 * (fVar7 + 2.0) * 0.15915494;
      fVar7 = (wi->field_0).m128[2] * (dg->Ns).field_0.m128[2] +
              (wi->field_0).m128[1] * (dg->Ns).field_0.m128[1] +
              (wi->field_0).m128[0] * (dg->Ns).field_0.m128[0];
      if (1.0 <= fVar7) {
        fVar7 = 1.0;
      }
      uVar6 = CONCAT44((wi->field_0).m128[3] * (dg->Ns).field_0.m128[3],fVar7);
      fVar8 = 0.0;
      if (0.0 <= fVar7) {
        fVar8 = fVar7;
      }
      fVar8 = fVar8 * fVar4;
      fVar7 = (brdf->Ks).field_0.m128[1];
      fVar1 = (brdf->Ks).field_0.m128[2];
      fVar5 = (brdf->Ks).field_0.m128[3];
      *(float *)this = fVar8 * (brdf->Ks).field_0.m128[0] + *(float *)this;
      *(float *)(this + 4) = fVar8 * fVar7 + *(float *)(this + 4);
      *(float *)(this + 8) = fVar8 * fVar1 + *(float *)(this + 8);
      *(float *)(this + 0xc) = fVar8 * fVar5 + *(float *)(this + 0xc);
      fVar5 = extraout_XMM0_Db;
    }
  }
  VVar9.field_0.m128[1] = fVar5;
  VVar9.field_0.m128[0] = fVar4;
  VVar9.field_0._8_8_ = uVar6;
  return (Vec3fa)VVar9.field_0;
}

Assistant:

Vec3fa OBJMaterial__eval(ISPCOBJMaterial* material, const BRDF& brdf, const Vec3fa& wo, const DifferentialGeometry& dg, const Vec3fa& wi)
{
  Vec3fa R = Vec3fa(0.0f);
  const float Md = max(max(brdf.Kd.x,brdf.Kd.y),brdf.Kd.z);
  const float Ms = max(max(brdf.Ks.x,brdf.Ks.y),brdf.Ks.z);
  const float Mt = max(max(brdf.Kt.x,brdf.Kt.y),brdf.Kt.z);
  if (Md > 0.0f) {
    R = R + (1.0f/float(M_PI)) * clamp(dot(wi,dg.Ns)) * brdf.Kd;
  }
  if (Ms > 0.0f) {
    const Sample3f refl = make_Sample3f(reflect(wo,dg.Ns),1.0f);
    if (dot(refl.v,wi) > 0.0f)
      R = R + (brdf.Ns+2) * float(one_over_two_pi) * powf(max(1e-10f,dot(refl.v,wi)),brdf.Ns) * clamp(dot(wi,dg.Ns)) * brdf.Ks;
  }
  if (Mt > 0.0f) {
  }
  return R;
}